

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O1

_Bool trans_VMOV_to_gp(DisasContext_conflict1 *s,arg_VMOV_to_gp *a)

{
  TCGContext_conflict1 *tcg_ctx;
  byte bVar1;
  _Bool _Var2;
  TCGv_i32 ret;
  _Bool _Var3;
  uint uVar4;
  uint uVar5;
  
  tcg_ctx = s->uc->tcg_ctx;
  if (a->size == 2) {
    bVar1 = (byte)s->isar->mvfr0 & 0xf0;
  }
  else {
    bVar1 = *(byte *)((long)&s->features + 1) & 1;
  }
  if ((bVar1 == 0) || (((s->isar->mvfr0 & 0xe) == 0 && ((a->vn & 0x10) != 0)))) {
    _Var3 = false;
  }
  else {
    uVar4 = a->index << ((byte)a->size & 0x1f);
    _Var2 = full_vfp_access_check(s,false);
    _Var3 = true;
    if (_Var2) {
      uVar5 = uVar4 & 3;
      ret = neon_load_reg(tcg_ctx,a->vn,uVar4 >> 2 & 1);
      if (a->size == 1) {
        if (a->u == 0) {
          if (uVar5 == 0) {
            tcg_gen_ext16s_i32_aarch64(tcg_ctx,ret,ret);
          }
          else {
            tcg_gen_sari_i32_aarch64(tcg_ctx,ret,ret,0x10);
          }
        }
        else if (uVar5 == 0) {
          tcg_gen_ext16u_i32_aarch64(tcg_ctx,ret,ret);
        }
        else {
          tcg_gen_shri_i32_aarch64(tcg_ctx,ret,ret,0x10);
        }
      }
      else if (a->size == 0) {
        if (uVar5 != 0) {
          tcg_gen_shri_i32_aarch64(tcg_ctx,ret,ret,uVar5 << 3);
        }
        if (a->u == 0) {
          tcg_gen_ext8s_i32_aarch64(tcg_ctx,ret,ret);
        }
        else {
          tcg_gen_ext8u_i32_aarch64(tcg_ctx,ret,ret);
        }
      }
      store_reg(s,a->rt,ret);
    }
  }
  return _Var3;
}

Assistant:

static bool trans_VMOV_to_gp(DisasContext *s, arg_VMOV_to_gp *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    /* VMOV scalar to general purpose register */
    TCGv_i32 tmp;
    int pass;
    uint32_t offset;

    /* SIZE == 2 is a VFP instruction; otherwise NEON.  */
    if (a->size == 2
        ? !dc_isar_feature(aa32_fpsp_v2, s)
        : !arm_dc_feature(s, ARM_FEATURE_NEON)) {
        return false;
    }

    /* UNDEF accesses to D16-D31 if they don't exist */
    if (!dc_isar_feature(aa32_simd_r32, s) && (a->vn & 0x10)) {
        return false;
    }

    offset = a->index << a->size;
    pass = extract32(offset, 2, 1);
    offset = extract32(offset, 0, 2) * 8;

    if (!vfp_access_check(s)) {
        return true;
    }

    tmp = neon_load_reg(tcg_ctx, a->vn, pass);
    switch (a->size) {
    case 0:
        if (offset) {
            tcg_gen_shri_i32(tcg_ctx, tmp, tmp, offset);
        }
        if (a->u) {
            gen_uxtb(tmp);
        } else {
            gen_sxtb(tmp);
        }
        break;
    case 1:
        if (a->u) {
            if (offset) {
                tcg_gen_shri_i32(tcg_ctx, tmp, tmp, 16);
            } else {
                gen_uxth(tmp);
            }
        } else {
            if (offset) {
                tcg_gen_sari_i32(tcg_ctx, tmp, tmp, 16);
            } else {
                gen_sxth(tmp);
            }
        }
        break;
    case 2:
        break;
    }
    store_reg(s, a->rt, tmp);

    return true;
}